

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::CopyImportedCxxModulesProperties(cmTarget *this,cmTarget *tgt)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pcVar4;
  cmGlobalGenerator *pcVar5;
  allocator<char> local_159;
  string local_158;
  cmValue local_138;
  cmValue xcodeGenerateScheme;
  string local_128;
  static_string_view *local_108;
  static_string_view *perConfigProp;
  static_string_view *__end2;
  static_string_view *__begin2;
  static_string_view (*__range2) [4];
  string configUpper;
  string *configName;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string *prop;
  string *__end1;
  string *__begin1;
  string (*__range1) [36];
  anon_class_16_2_633baf8e copyProperty;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  string *local_20;
  cmTarget *local_18;
  cmTarget *tgt_local;
  cmTarget *this_local;
  
  local_18 = tgt;
  tgt_local = this;
  bVar1 = IsNormal(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->IsNormal()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                  ,0x70c,"void cmTarget::CopyImportedCxxModulesProperties(const cmTarget *)");
  }
  bVar1 = IsImported(this);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = IsImported(local_18);
    if (bVar1) {
      if ((CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ == '\0')
         && (iVar2 = __cxa_guard_acquire(&CopyImportedCxxModulesProperties(cmTarget_const*)::
                                          propertiesToCopy_abi_cxx11_), iVar2 != 0)) {
        copyProperty.tgt._0_1_ = 1;
        local_20 = CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_,
                   "DEFINE_SYMBOL",&local_21);
        local_20 = (string *)0x169b160;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   1),"DEPRECATION",local_35);
        local_20 = (string *)0x169b180;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   2),"NO_SYSTEM_FROM_IMPORTED",&local_36);
        local_20 = (string *)0x169b1a0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   3),"POSITION_INDEPENDENT_CODE",&local_37);
        local_20 = (string *)0x169b1c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   4),"VISIBILITY_INLINES_HIDDEN",&local_38);
        local_20 = (string *)0x169b1e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   5),"ANDROID_API",&local_39);
        local_20 = (string *)0x169b200;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   6),"ANDROID_API_MIN",&local_3a);
        local_20 = (string *)0x169b220;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   7),"ANDROID_ARCH",&local_3b);
        local_20 = (string *)0x169b240;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   8),"ANDROID_STL_TYPE",&local_3c);
        local_20 = (string *)0x169b260;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   9),"OSX_ARCHITECTURES",&local_3d);
        local_20 = (string *)0x169b280;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   10),"MSVC_DEBUG_INFORMATION_FORMAT",&local_3e);
        local_20 = (string *)0x169b2a0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0xb),"MSVC_RUNTIME_LIBRARY",&local_3f);
        local_20 = (string *)0x169b2c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0xc),"VS_PLATFORM_TOOLSET",&local_40);
        local_20 = (string *)0x169b2e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0xd),"WATCOM_RUNTIME_LIBRARY",&local_41);
        local_20 = (string *)0x169b300;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0xe),"CXX_COMPILER_LAUNCHER",&local_42);
        local_20 = (string *)0x169b320;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0xf),"CXX_STANDARD",&local_43);
        local_20 = (string *)0x169b340;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x10),"CXX_STANDARD_REQUIRED",&local_44);
        local_20 = (string *)0x169b360;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x11),"CXX_EXTENSIONS",&local_45);
        local_20 = (string *)0x169b380;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x12),"CXX_VISIBILITY_PRESET",&local_46);
        local_20 = (string *)0x169b3a0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x13),"CXX_CLANG_TIDY",&local_47);
        local_20 = (string *)0x169b3c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x14),"CXX_CLANG_TIDY_EXPORT_FIXES_DIR",&local_48);
        local_20 = (string *)0x169b3e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x15),"CXX_CPPLINT",&local_49);
        local_20 = (string *)0x169b400;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x16),"CXX_CPPCHECK",&local_4a);
        local_20 = (string *)0x169b420;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x17),"CXX_INCLUDE_WHAT_YOU_USE",&local_4b);
        local_20 = (string *)0x169b440;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x18),"EXCLUDE_FROM_ALL",&local_4c);
        local_20 = (string *)0x169b460;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x19),"EXCLUDE_FROM_DEFAULT_BUILD",&local_4d);
        local_20 = (string *)0x169b480;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x1a),"OPTIMIZE_DEPENDENCIES",&local_4e);
        local_20 = (string *)0x169b4a0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x1b),"JOB_POOL_COMPILE",&local_4f);
        local_20 = (string *)0x169b4c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x1c),"VS_NO_COMPILE_BATCHING",&local_50);
        local_20 = (string *)0x169b4e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x1d),"VS_PROJECT_IMPORT",(allocator<char> *)((long)&copyProperty.tgt + 7));
        local_20 = (string *)0x169b500;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x1e),"EchoString",(allocator<char> *)((long)&copyProperty.tgt + 6));
        local_20 = (string *)0x169b520;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x1f),"EXPORT_COMPILE_COMMANDS",(allocator<char> *)((long)&copyProperty.tgt + 5))
        ;
        local_20 = (string *)0x169b540;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x20),"FOLDER",(allocator<char> *)((long)&copyProperty.tgt + 4));
        local_20 = (string *)0x169b560;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x21),"LABELS",(allocator<char> *)((long)&copyProperty.tgt + 3));
        local_20 = (string *)0x169b580;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x22),"PROJECT_LABEL",(allocator<char> *)((long)&copyProperty.tgt + 2));
        local_20 = (string *)0x169b5a0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ +
                   0x23),"SYSTEM",(allocator<char> *)((long)&copyProperty.tgt + 1));
        copyProperty.tgt._0_1_ = 0;
        std::allocator<char>::~allocator((allocator<char> *)((long)&copyProperty.tgt + 1));
        std::allocator<char>::~allocator((allocator<char> *)((long)&copyProperty.tgt + 2));
        std::allocator<char>::~allocator((allocator<char> *)((long)&copyProperty.tgt + 3));
        std::allocator<char>::~allocator((allocator<char> *)((long)&copyProperty.tgt + 4));
        std::allocator<char>::~allocator((allocator<char> *)((long)&copyProperty.tgt + 5));
        std::allocator<char>::~allocator((allocator<char> *)((long)&copyProperty.tgt + 6));
        std::allocator<char>::~allocator((allocator<char> *)((long)&copyProperty.tgt + 7));
        std::allocator<char>::~allocator(&local_50);
        std::allocator<char>::~allocator(&local_4f);
        std::allocator<char>::~allocator(&local_4e);
        std::allocator<char>::~allocator(&local_4d);
        std::allocator<char>::~allocator(&local_4c);
        std::allocator<char>::~allocator(&local_4b);
        std::allocator<char>::~allocator(&local_4a);
        std::allocator<char>::~allocator(&local_49);
        std::allocator<char>::~allocator(&local_48);
        std::allocator<char>::~allocator(&local_47);
        std::allocator<char>::~allocator(&local_46);
        std::allocator<char>::~allocator(&local_45);
        std::allocator<char>::~allocator(&local_44);
        std::allocator<char>::~allocator(&local_43);
        std::allocator<char>::~allocator(&local_42);
        std::allocator<char>::~allocator(&local_41);
        std::allocator<char>::~allocator(&local_40);
        std::allocator<char>::~allocator(&local_3f);
        std::allocator<char>::~allocator(&local_3e);
        std::allocator<char>::~allocator(&local_3d);
        std::allocator<char>::~allocator(&local_3c);
        std::allocator<char>::~allocator(&local_3b);
        std::allocator<char>::~allocator(&local_3a);
        std::allocator<char>::~allocator(&local_39);
        std::allocator<char>::~allocator(&local_38);
        std::allocator<char>::~allocator(&local_37);
        std::allocator<char>::~allocator(&local_36);
        std::allocator<char>::~allocator(local_35);
        std::allocator<char>::~allocator(&local_21);
        __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
        __cxa_guard_release(&CopyImportedCxxModulesProperties(cmTarget_const*)::
                             propertiesToCopy_abi_cxx11_);
      }
      copyProperty.this = local_18;
      __end1 = CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_;
      __range1 = (string (*) [36])this;
      while( true ) {
        if (__end1 == (string *)
                      &CopyImportedCxxModulesProperties(cmTarget_const*)::
                       propertiesToCopy_abi_cxx11_) break;
        configNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CopyImportedCxxModulesProperties::anon_class_16_2_633baf8e::operator()
                                ((anon_class_16_2_633baf8e *)&__range1,__end1);
        __end1 = __end1 + 1;
      }
      if (CopyImportedCxxModulesProperties(cmTarget_const*)::perConfigPropertiesToCopy == '\0') {
        iVar2 = __cxa_guard_acquire(&CopyImportedCxxModulesProperties(cmTarget_const*)::
                                     perConfigPropertiesToCopy);
        if (iVar2 != 0) {
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[0] =
               ::cm::operator____s("EXCLUDE_FROM_DEFAULT_BUILD_",0x1b);
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[1] =
               ::cm::operator____s("IMPORTED_CXX_MODULES_",0x15);
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[2] =
               ::cm::operator____s("MAP_IMPORTED_CONFIG_",0x14);
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[3] =
               ::cm::operator____s("OSX_ARCHITECTURES_",0x12);
          __cxa_guard_release(&CopyImportedCxxModulesProperties(cmTarget_const*)::
                               perConfigPropertiesToCopy);
        }
      }
      pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      cmMakefile::GetGeneratorConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1,pcVar4->Makefile,ExcludeEmptyConfig);
      __end1_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1_1);
      configName = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1_1);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&configName);
        if (!bVar1) break;
        configUpper.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
        cmsys::SystemTools::UpperCase((string *)&__range2,(string *)configUpper.field_2._8_8_);
        __begin2 = CopyImportedCxxModulesProperties::perConfigPropertiesToCopy;
        perConfigProp =
             (static_string_view *)
             &CopyImportedCxxModulesProperties(cmTarget_const*)::perConfigPropertiesToCopy;
        for (__end2 = CopyImportedCxxModulesProperties::perConfigPropertiesToCopy;
            __end2 != perConfigProp; __end2 = __end2 + 1) {
          local_108 = __end2;
          cmStrCat<cm::static_string_view_const&,std::__cxx11::string&>
                    (&local_128,__end2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2)
          ;
          xcodeGenerateScheme =
               CopyImportedCxxModulesProperties::anon_class_16_2_633baf8e::operator()
                         ((anon_class_16_2_633baf8e *)&__range1,&local_128);
          std::__cxx11::string::~string((string *)&local_128);
        }
        std::__cxx11::string::~string((string *)&__range2);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_1);
      }
      pcVar5 = GetGlobalGenerator(this);
      uVar3 = (*pcVar5->_vptr_cmGlobalGenerator[0x29])();
      if ((uVar3 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"XCODE_GENERATE_SCHEME",&local_159);
        local_138 = CopyImportedCxxModulesProperties::anon_class_16_2_633baf8e::operator()
                              ((anon_class_16_2_633baf8e *)&__range1,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator(&local_159);
        cmValue::IsOn(&local_138);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1_1);
      return;
    }
    __assert_fail("tgt->IsImported()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                  ,0x710,"void cmTarget::CopyImportedCxxModulesProperties(const cmTarget *)");
  }
  __assert_fail("!this->IsImported()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                ,0x70e,"void cmTarget::CopyImportedCxxModulesProperties(const cmTarget *)");
}

Assistant:

void cmTarget::CopyImportedCxxModulesProperties(cmTarget const* tgt)
{
  // Normal targets cannot be the target of a copy.
  assert(!this->IsNormal());
  // Imported targets cannot be the target of a copy.
  assert(!this->IsImported());
  // Only imported targets can be the source of a copy.
  assert(tgt->IsImported());

  // The list of properties that are relevant here include:
  // - compilation-specific properties for any language or platform
  // - compilation-specific properties for C++
  // - build graph-specific properties that affect compilation
  // - IDE metadata properties
  // - static analysis properties

  static const std::string propertiesToCopy[] = {
    // Compilation properties
    "DEFINE_SYMBOL",
    "DEPRECATION",
    "NO_SYSTEM_FROM_IMPORTED",
    "POSITION_INDEPENDENT_CODE",
    "VISIBILITY_INLINES_HIDDEN",
    // -- Platforms
    // ---- Android
    "ANDROID_API",
    "ANDROID_API_MIN",
    "ANDROID_ARCH",
    "ANDROID_STL_TYPE",
    // ---- macOS
    "OSX_ARCHITECTURES",
    // ---- Windows
    "MSVC_DEBUG_INFORMATION_FORMAT",
    "MSVC_RUNTIME_LIBRARY",
    "VS_PLATFORM_TOOLSET",
    // ---- OpenWatcom
    "WATCOM_RUNTIME_LIBRARY",
    // -- Language
    // ---- C++
    "CXX_COMPILER_LAUNCHER",
    "CXX_STANDARD",
    "CXX_STANDARD_REQUIRED",
    "CXX_EXTENSIONS",
    "CXX_VISIBILITY_PRESET",

    // Static analysis
    "CXX_CLANG_TIDY",
    "CXX_CLANG_TIDY_EXPORT_FIXES_DIR",
    "CXX_CPPLINT",
    "CXX_CPPCHECK",
    "CXX_INCLUDE_WHAT_YOU_USE",

    // Build graph properties
    "EXCLUDE_FROM_ALL",
    "EXCLUDE_FROM_DEFAULT_BUILD",
    "OPTIMIZE_DEPENDENCIES",
    // -- Ninja
    "JOB_POOL_COMPILE",
    // -- Visual Studio
    "VS_NO_COMPILE_BATCHING",
    "VS_PROJECT_IMPORT",

    // Metadata
    "EchoString",
    "EXPORT_COMPILE_COMMANDS",
    "FOLDER",
    "LABELS",
    "PROJECT_LABEL",
    "SYSTEM",
  };

  auto copyProperty = [this, tgt](std::string const& prop) -> cmValue {
    cmValue value = tgt->GetProperty(prop);
    // Always set the property; it may have been explicitly unset.
    this->SetProperty(prop, value);
    return value;
  };

  for (auto const& prop : propertiesToCopy) {
    copyProperty(prop);
  }

  static const cm::static_string_view perConfigPropertiesToCopy[] = {
    "EXCLUDE_FROM_DEFAULT_BUILD_"_s,
    "IMPORTED_CXX_MODULES_"_s,
    "MAP_IMPORTED_CONFIG_"_s,
    "OSX_ARCHITECTURES_"_s,
  };

  std::vector<std::string> configNames =
    this->impl->Makefile->GetGeneratorConfigs(cmMakefile::ExcludeEmptyConfig);
  for (std::string const& configName : configNames) {
    std::string configUpper = cmSystemTools::UpperCase(configName);
    for (auto const& perConfigProp : perConfigPropertiesToCopy) {
      copyProperty(cmStrCat(perConfigProp, configUpper));
    }
  }

  if (this->GetGlobalGenerator()->IsXcode()) {
    cmValue xcodeGenerateScheme = copyProperty("XCODE_GENERATE_SCHEME");

    // TODO: Make sure these show up on the imported target in the first place
    // XCODE_ATTRIBUTE_???

    if (xcodeGenerateScheme.IsOn()) {
#ifdef __APPLE__
      static const std::string xcodeSchemePropertiesToCopy[] = {
        // FIXME: Do all of these apply? Do they matter?
        "XCODE_SCHEME_ADDRESS_SANITIZER",
        "XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN",
        "XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER",
        "XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS",
        "XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE",
        "XCODE_SCHEME_ENABLE_GPU_API_VALIDATION",
        "XCODE_SCHEME_ENABLE_GPU_SHADER_VALIDATION",
        "XCODE_SCHEME_GUARD_MALLOC",
        "XCODE_SCHEME_LAUNCH_CONFIGURATION",
        "XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP",
        "XCODE_SCHEME_MALLOC_GUARD_EDGES",
        "XCODE_SCHEME_MALLOC_SCRIBBLE",
        "XCODE_SCHEME_MALLOC_STACK",
        "XCODE_SCHEME_THREAD_SANITIZER",
        "XCODE_SCHEME_THREAD_SANITIZER_STOP",
        "XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER",
        "XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP",
        "XCODE_SCHEME_ZOMBIE_OBJECTS",
      };

      for (auto const& xcodeProperty : xcodeSchemePropertiesToCopy) {
        copyProperty(xcodeProperty);
      }
#endif
    }
  }
}